

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

void make_session_filename(char *in,strbuf *out)

{
  strbuf *out_local;
  char *in_local;
  
  if ((in == (char *)0x0) || (out_local = (strbuf *)in, *in == '\0')) {
    out_local = (strbuf *)anon_var_dwarf_3fc1c;
  }
  for (; *(char *)&out_local->s != '\0'; out_local = (strbuf *)((long)&out_local->s + 1)) {
    if ((((((*(char *)&out_local->s == '+') || (*(char *)&out_local->s == '-')) ||
          (*(char *)&out_local->s == '.')) ||
         ((*(char *)&out_local->s == '@' || (*(char *)&out_local->s == '_')))) ||
        (('/' < *(char *)&out_local->s && (*(char *)&out_local->s < ':')))) ||
       ((('@' < *(char *)&out_local->s && (*(char *)&out_local->s < '[')) ||
        (('`' < *(char *)&out_local->s && (*(char *)&out_local->s < '{')))))) {
      BinarySink_put_byte(out->binarysink_,*(uchar *)&out_local->s);
    }
    else {
      BinarySink_put_byte(out->binarysink_,'%');
      BinarySink_put_byte(out->binarysink_,
                          "0123456789ABCDEF"[(int)(uint)*(byte *)&out_local->s >> 4]);
      BinarySink_put_byte(out->binarysink_,"0123456789ABCDEF"[(int)(*(byte *)&out_local->s & 0xf)]);
    }
  }
  return;
}

Assistant:

static void make_session_filename(const char *in, strbuf *out)
{
    if (!in || !*in)
        in = "Default Settings";

    while (*in) {
        /*
         * There are remarkably few punctuation characters that
         * aren't shell-special in some way or likely to be used as
         * separators in some file format or another! Hence we use
         * opt-in for safe characters rather than opt-out for
         * specific unsafe ones...
         */
        if (*in!='+' && *in!='-' && *in!='.' && *in!='@' && *in!='_' &&
            !(*in >= '0' && *in <= '9') &&
            !(*in >= 'A' && *in <= 'Z') &&
            !(*in >= 'a' && *in <= 'z')) {
            put_byte(out, '%');
            put_byte(out, hex[((unsigned char) *in) >> 4]);
            put_byte(out, hex[((unsigned char) *in) & 15]);
        } else
            put_byte(out, *in);
        in++;
    }
}